

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrASL0x16(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  byte value;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  
  addr = this->PC;
  this->PC = addr + 1;
  uVar1 = Memory::Read8(this->m,addr);
  bVar2 = uVar1 + this->X;
  this_00 = this->m;
  bVar3 = Memory::Read8(this_00,(ushort)bVar2);
  value = bVar3 * '\x02';
  this->field_0x2e = bVar3 & 0x80 | value >> 7 | (value == 0) << 6 | this->field_0x2e & 0x3e;
  Memory::Write8(this_00,(ushort)bVar2,value);
  return 6;
}

Assistant:

int CPU::instrASL0x16() {
	uint16_t address = zeropage_x_addr_j();
	m->Write8(address, ASL(m->Read8(address)));
	return 6;
}